

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2UnicodeClasses(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_5c20;
  LogMessage local_5aa0;
  LogMessage local_5920;
  LogMessage local_57a0;
  string *local_5620;
  string *local_5618;
  string *local_5610;
  RE2 local_5608;
  StringPiece local_5528;
  LogMessage local_5518;
  RE2 local_5398;
  StringPiece local_52b8;
  LogMessage local_52a8;
  LogMessage local_5128;
  LogMessage local_4fa8;
  LogMessage local_4e28;
  string *local_4ca8;
  string *local_4ca0;
  string *local_4c98;
  RE2 local_4c90;
  StringPiece local_4bb0;
  LogMessage local_4ba0;
  RE2 local_4a20;
  StringPiece local_4940;
  LogMessage local_4930;
  LogMessage local_47b0;
  LogMessage local_4630;
  LogMessage local_44b0;
  string *local_4330;
  string *local_4328;
  string *local_4320;
  RE2 local_4318;
  StringPiece local_4238;
  LogMessage local_4228;
  LogMessage local_40a8;
  LogMessage local_3f28;
  LogMessage local_3da8;
  string *local_3c28;
  string *local_3c20;
  string *local_3c18;
  RE2 local_3c10;
  StringPiece local_3b30;
  LogMessage local_3b20;
  RE2 local_39a0;
  StringPiece local_38c0;
  LogMessage local_38b0;
  RE2 local_3730;
  StringPiece local_3650;
  LogMessage local_3640;
  RE2 local_34c0;
  StringPiece local_33e0;
  LogMessage local_33d0;
  RE2 local_3250;
  StringPiece local_3170;
  LogMessage local_3160;
  RE2 local_2fe0;
  StringPiece local_2f00;
  LogMessage local_2ef0;
  RE2 local_2d70;
  StringPiece local_2c90;
  LogMessage local_2c80;
  RE2 local_2b00;
  StringPiece local_2a20;
  LogMessage local_2a10;
  RE2 local_2890;
  StringPiece local_27b0;
  LogMessage local_27a0;
  RE2 local_2620;
  StringPiece local_2540;
  LogMessage local_2530;
  RE2 local_23b0;
  StringPiece local_22d0;
  LogMessage local_22c0;
  RE2 local_2140;
  StringPiece local_2060;
  LogMessage local_2050;
  RE2 local_1ed0;
  StringPiece local_1df0;
  LogMessage local_1de0;
  RE2 local_1c60;
  StringPiece local_1b80;
  LogMessage local_1b70;
  RE2 local_19f0;
  StringPiece local_1910;
  LogMessage local_1900;
  RE2 local_1780;
  StringPiece local_16a0;
  LogMessage local_1690;
  RE2 local_1510;
  StringPiece local_1430;
  LogMessage local_1420;
  RE2 local_12a0;
  StringPiece local_11c0;
  LogMessage local_11b0;
  RE2 local_1030;
  StringPiece local_f50;
  LogMessage local_f40;
  RE2 local_dc0;
  StringPiece local_ce0;
  LogMessage local_cd0;
  RE2 local_b50;
  StringPiece local_a70;
  LogMessage local_a60;
  RE2 local_8e0;
  StringPiece local_800;
  LogMessage local_7f0;
  RE2 local_670;
  StringPiece local_590;
  LogMessage local_580;
  RE2 local_400;
  StringPiece local_320;
  LogMessage local_310;
  RE2 local_190;
  StringPiece local_b0;
  string local_a0 [8];
  string c;
  string local_80 [8];
  string b;
  string local_60 [8];
  string a;
  allocator local_29;
  string local_28 [8];
  string str;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,anon_var_dwarf_5be6,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::string(local_80);
  std::__cxx11::string::string(local_a0);
  StringPiece::StringPiece(&local_b0,"A");
  RE2::RE2(&local_190,"\\p{L}");
  bVar1 = RE2::FullMatch<>(&local_b0,&local_190);
  RE2::~RE2(&local_190);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_310,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x551);
    poVar2 = LogMessage::stream(&local_310);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"A\", \"\\\\p{L}\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_310);
  }
  StringPiece::StringPiece(&local_320,"A");
  RE2::RE2(&local_400,"\\p{Lu}");
  bVar1 = RE2::FullMatch<>(&local_320,&local_400);
  RE2::~RE2(&local_400);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_580,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x552);
    poVar2 = LogMessage::stream(&local_580);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"A\", \"\\\\p{Lu}\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_580);
  }
  StringPiece::StringPiece(&local_590,"A");
  RE2::RE2(&local_670,"\\p{Ll}");
  bVar1 = RE2::FullMatch<>(&local_590,&local_670);
  RE2::~RE2(&local_670);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_7f0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x553);
    poVar2 = LogMessage::stream(&local_7f0);
    std::operator<<(poVar2,"Check failed: !(RE2::FullMatch(\"A\", \"\\\\p{Ll}\"))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_7f0);
  }
  StringPiece::StringPiece(&local_800,"A");
  RE2::RE2(&local_8e0,"\\P{L}");
  bVar1 = RE2::FullMatch<>(&local_800,&local_8e0);
  RE2::~RE2(&local_8e0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a60,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x554);
    poVar2 = LogMessage::stream(&local_a60);
    std::operator<<(poVar2,"Check failed: !(RE2::FullMatch(\"A\", \"\\\\P{L}\"))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a60);
  }
  StringPiece::StringPiece(&local_a70,"A");
  RE2::RE2(&local_b50,"\\P{Lu}");
  bVar1 = RE2::FullMatch<>(&local_a70,&local_b50);
  RE2::~RE2(&local_b50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_cd0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x555);
    poVar2 = LogMessage::stream(&local_cd0);
    std::operator<<(poVar2,"Check failed: !(RE2::FullMatch(\"A\", \"\\\\P{Lu}\"))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_cd0);
  }
  StringPiece::StringPiece(&local_ce0,"A");
  RE2::RE2(&local_dc0,"\\P{Ll}");
  bVar1 = RE2::FullMatch<>(&local_ce0,&local_dc0);
  RE2::~RE2(&local_dc0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f40,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x556);
    poVar2 = LogMessage::stream(&local_f40);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"A\", \"\\\\P{Ll}\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_f40);
  }
  StringPiece::StringPiece(&local_f50,anon_var_dwarf_5c82);
  RE2::RE2(&local_1030,"\\p{L}");
  bVar1 = RE2::FullMatch<>(&local_f50,&local_1030);
  RE2::~RE2(&local_1030);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_11b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x558);
    poVar2 = LogMessage::stream(&local_11b0);
    std::operator<<(poVar2,anon_var_dwarf_5c8e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_11b0);
  }
  StringPiece::StringPiece(&local_11c0,anon_var_dwarf_5c82);
  RE2::RE2(&local_12a0,"\\p{Lu}");
  bVar1 = RE2::FullMatch<>(&local_11c0,&local_12a0);
  RE2::~RE2(&local_12a0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1420,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x559);
    poVar2 = LogMessage::stream(&local_1420);
    std::operator<<(poVar2,anon_var_dwarf_5c9a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1420);
  }
  StringPiece::StringPiece(&local_1430,anon_var_dwarf_5c82);
  RE2::RE2(&local_1510,"\\p{Ll}");
  bVar1 = RE2::FullMatch<>(&local_1430,&local_1510);
  RE2::~RE2(&local_1510);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1690,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55a);
    poVar2 = LogMessage::stream(&local_1690);
    std::operator<<(poVar2,anon_var_dwarf_5ca6);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1690);
  }
  StringPiece::StringPiece(&local_16a0,anon_var_dwarf_5c82);
  RE2::RE2(&local_1780,"\\P{L}");
  bVar1 = RE2::FullMatch<>(&local_16a0,&local_1780);
  RE2::~RE2(&local_1780);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1900,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55b);
    poVar2 = LogMessage::stream(&local_1900);
    std::operator<<(poVar2,anon_var_dwarf_5cb2);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1900);
  }
  StringPiece::StringPiece(&local_1910,anon_var_dwarf_5c82);
  RE2::RE2(&local_19f0,"\\P{Lu}");
  bVar1 = RE2::FullMatch<>(&local_1910,&local_19f0);
  RE2::~RE2(&local_19f0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b70,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55c);
    poVar2 = LogMessage::stream(&local_1b70);
    std::operator<<(poVar2,anon_var_dwarf_5cbe);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b70);
  }
  StringPiece::StringPiece(&local_1b80,anon_var_dwarf_5c82);
  RE2::RE2(&local_1c60,"\\P{Ll}");
  bVar1 = RE2::FullMatch<>(&local_1b80,&local_1c60);
  RE2::~RE2(&local_1c60);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1de0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55d);
    poVar2 = LogMessage::stream(&local_1de0);
    std::operator<<(poVar2,anon_var_dwarf_5cca);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1de0);
  }
  StringPiece::StringPiece(&local_1df0,anon_var_dwarf_5cd6);
  RE2::RE2(&local_1ed0,"\\p{L}");
  bVar1 = RE2::FullMatch<>(&local_1df0,&local_1ed0);
  RE2::~RE2(&local_1ed0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2050,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55f);
    poVar2 = LogMessage::stream(&local_2050);
    std::operator<<(poVar2,anon_var_dwarf_5ce2);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2050);
  }
  StringPiece::StringPiece(&local_2060,anon_var_dwarf_5cd6);
  RE2::RE2(&local_2140,"\\p{Lu}");
  bVar1 = RE2::FullMatch<>(&local_2060,&local_2140);
  RE2::~RE2(&local_2140);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_22c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x560);
    poVar2 = LogMessage::stream(&local_22c0);
    std::operator<<(poVar2,anon_var_dwarf_5cee);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_22c0);
  }
  StringPiece::StringPiece(&local_22d0,anon_var_dwarf_5cd6);
  RE2::RE2(&local_23b0,"\\p{Ll}");
  bVar1 = RE2::FullMatch<>(&local_22d0,&local_23b0);
  RE2::~RE2(&local_23b0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2530,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x561);
    poVar2 = LogMessage::stream(&local_2530);
    std::operator<<(poVar2,anon_var_dwarf_5cfa);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2530);
  }
  StringPiece::StringPiece(&local_2540,anon_var_dwarf_5cd6);
  RE2::RE2(&local_2620,"\\P{L}");
  bVar1 = RE2::FullMatch<>(&local_2540,&local_2620);
  RE2::~RE2(&local_2620);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_27a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x562);
    poVar2 = LogMessage::stream(&local_27a0);
    std::operator<<(poVar2,anon_var_dwarf_5d06);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_27a0);
  }
  StringPiece::StringPiece(&local_27b0,anon_var_dwarf_5cd6);
  RE2::RE2(&local_2890,"\\P{Lu}");
  bVar1 = RE2::FullMatch<>(&local_27b0,&local_2890);
  RE2::~RE2(&local_2890);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2a10,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x563);
    poVar2 = LogMessage::stream(&local_2a10);
    std::operator<<(poVar2,anon_var_dwarf_5d12);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2a10);
  }
  StringPiece::StringPiece(&local_2a20,anon_var_dwarf_5cd6);
  RE2::RE2(&local_2b00,"\\P{Ll}");
  bVar1 = RE2::FullMatch<>(&local_2a20,&local_2b00);
  RE2::~RE2(&local_2b00);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2c80,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x564);
    poVar2 = LogMessage::stream(&local_2c80);
    std::operator<<(poVar2,anon_var_dwarf_5d1e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2c80);
  }
  StringPiece::StringPiece(&local_2c90,anon_var_dwarf_5be6 + 0xf);
  RE2::RE2(&local_2d70,"\\p{L}");
  bVar1 = RE2::FullMatch<>(&local_2c90,&local_2d70);
  RE2::~RE2(&local_2d70);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2ef0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x566);
    poVar2 = LogMessage::stream(&local_2ef0);
    std::operator<<(poVar2,anon_var_dwarf_5d36);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2ef0);
  }
  StringPiece::StringPiece(&local_2f00,anon_var_dwarf_5be6 + 0xf);
  RE2::RE2(&local_2fe0,"\\p{Lu}");
  bVar1 = RE2::FullMatch<>(&local_2f00,&local_2fe0);
  RE2::~RE2(&local_2fe0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_3160,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x567);
    poVar2 = LogMessage::stream(&local_3160);
    std::operator<<(poVar2,anon_var_dwarf_5d42);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3160);
  }
  StringPiece::StringPiece(&local_3170,anon_var_dwarf_5be6 + 0xf);
  RE2::RE2(&local_3250,"\\p{Ll}");
  bVar1 = RE2::FullMatch<>(&local_3170,&local_3250);
  RE2::~RE2(&local_3250);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_33d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x568);
    poVar2 = LogMessage::stream(&local_33d0);
    std::operator<<(poVar2,anon_var_dwarf_5d4e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_33d0);
  }
  StringPiece::StringPiece(&local_33e0,anon_var_dwarf_5be6 + 0xf);
  RE2::RE2(&local_34c0,"\\P{L}");
  bVar1 = RE2::FullMatch<>(&local_33e0,&local_34c0);
  RE2::~RE2(&local_34c0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_3640,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x569);
    poVar2 = LogMessage::stream(&local_3640);
    std::operator<<(poVar2,anon_var_dwarf_5d5a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3640);
  }
  StringPiece::StringPiece(&local_3650,anon_var_dwarf_5be6 + 0xf);
  RE2::RE2(&local_3730,"\\P{Lu}");
  bVar1 = RE2::FullMatch<>(&local_3650,&local_3730);
  RE2::~RE2(&local_3730);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56a);
    poVar2 = LogMessage::stream(&local_38b0);
    std::operator<<(poVar2,anon_var_dwarf_5d66);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38b0);
  }
  StringPiece::StringPiece(&local_38c0,anon_var_dwarf_5be6 + 0xf);
  RE2::RE2(&local_39a0,"\\P{Ll}");
  bVar1 = RE2::FullMatch<>(&local_38c0,&local_39a0);
  RE2::~RE2(&local_39a0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_3b20,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56b);
    poVar2 = LogMessage::stream(&local_3b20);
    std::operator<<(poVar2,anon_var_dwarf_5d72);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3b20);
  }
  StringPiece::StringPiece(&local_3b30,(string *)local_28);
  RE2::RE2(&local_3c10,"(.).*?(.).*?(.)");
  local_3c18 = local_60;
  local_3c20 = local_80;
  local_3c28 = local_a0;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_3b30,&local_3c10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_3c18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_3c20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_3c28);
  RE2::~RE2(&local_3c10);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_3da8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56d);
    poVar2 = LogMessage::stream(&local_3da8);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(str, \"(.).*?(.).*?(.)\", &a, &b, &c)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3da8);
  }
  bVar1 = std::operator==("A",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_3f28,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56e);
    poVar2 = LogMessage::stream(&local_3f28);
    std::operator<<(poVar2,"Check failed: (\"A\") == (a)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3f28);
  }
  bVar1 = std::operator==("B",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_80);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56f);
    poVar2 = LogMessage::stream(&local_40a8);
    std::operator<<(poVar2,"Check failed: (\"B\") == (b)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40a8);
  }
  bVar1 = std::operator==("C",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4228,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x570);
    poVar2 = LogMessage::stream(&local_4228);
    std::operator<<(poVar2,"Check failed: (\"C\") == (c)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4228);
  }
  StringPiece::StringPiece(&local_4238,(string *)local_28);
  RE2::RE2(&local_4318,"(.).*?([\\p{L}]).*?(.)");
  local_4320 = local_60;
  local_4328 = local_80;
  local_4330 = local_a0;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_4238,&local_4318,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_4320,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_4328,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_4330);
  RE2::~RE2(&local_4318);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_44b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x572);
    poVar2 = LogMessage::stream(&local_44b0);
    std::operator<<(poVar2,
                    "Check failed: RE2::PartialMatch(str, \"(.).*?([\\\\p{L}]).*?(.)\", &a, &b, &c)"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_44b0);
  }
  bVar1 = std::operator==("A",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4630,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x573);
    poVar2 = LogMessage::stream(&local_4630);
    std::operator<<(poVar2,"Check failed: (\"A\") == (a)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4630);
  }
  bVar1 = std::operator==("B",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_80);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_47b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x574);
    poVar2 = LogMessage::stream(&local_47b0);
    std::operator<<(poVar2,"Check failed: (\"B\") == (b)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_47b0);
  }
  bVar1 = std::operator==("C",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4930,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x575);
    poVar2 = LogMessage::stream(&local_4930);
    std::operator<<(poVar2,"Check failed: (\"C\") == (c)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4930);
  }
  StringPiece::StringPiece(&local_4940,(string *)local_28);
  RE2::RE2(&local_4a20,"\\P{L}");
  bVar1 = RE2::PartialMatch<>(&local_4940,&local_4a20);
  RE2::~RE2(&local_4a20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4ba0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x577);
    poVar2 = LogMessage::stream(&local_4ba0);
    std::operator<<(poVar2,"Check failed: !(RE2::PartialMatch(str, \"\\\\P{L}\"))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4ba0);
  }
  StringPiece::StringPiece(&local_4bb0,(string *)local_28);
  RE2::RE2(&local_4c90,"(.).*?([\\p{Lu}]).*?(.)");
  local_4c98 = local_60;
  local_4ca0 = local_80;
  local_4ca8 = local_a0;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_4bb0,&local_4c90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_4c98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_4ca0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_4ca8);
  RE2::~RE2(&local_4c90);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4e28,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x579);
    poVar2 = LogMessage::stream(&local_4e28);
    std::operator<<(poVar2,
                    "Check failed: RE2::PartialMatch(str, \"(.).*?([\\\\p{Lu}]).*?(.)\", &a, &b, &c)"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4e28);
  }
  bVar1 = std::operator==("A",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4fa8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57a);
    poVar2 = LogMessage::stream(&local_4fa8);
    std::operator<<(poVar2,"Check failed: (\"A\") == (a)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4fa8);
  }
  bVar1 = std::operator==("B",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_80);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_5128,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57b);
    poVar2 = LogMessage::stream(&local_5128);
    std::operator<<(poVar2,"Check failed: (\"B\") == (b)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5128);
  }
  bVar1 = std::operator==("C",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_52a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57c);
    poVar2 = LogMessage::stream(&local_52a8);
    std::operator<<(poVar2,"Check failed: (\"C\") == (c)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_52a8);
  }
  StringPiece::StringPiece(&local_52b8,(string *)local_28);
  RE2::RE2(&local_5398,"[^\\p{Lu}\\p{Lo}]");
  bVar1 = RE2::PartialMatch<>(&local_52b8,&local_5398);
  RE2::~RE2(&local_5398);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_5518,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57e);
    poVar2 = LogMessage::stream(&local_5518);
    std::operator<<(poVar2,"Check failed: !(RE2::PartialMatch(str, \"[^\\\\p{Lu}\\\\p{Lo}]\"))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5518);
  }
  StringPiece::StringPiece(&local_5528,(string *)local_28);
  RE2::RE2(&local_5608,".*(.).*?([\\p{Lu}\\p{Lo}]).*?(.)");
  local_5610 = local_60;
  local_5618 = local_80;
  local_5620 = local_a0;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_5528,&local_5608,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_5610,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_5618,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_5620);
  RE2::~RE2(&local_5608);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_57a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x580);
    poVar2 = LogMessage::stream(&local_57a0);
    std::operator<<(poVar2,
                    "Check failed: RE2::PartialMatch(str, \".*(.).*?([\\\\p{Lu}\\\\p{Lo}]).*?(.)\", &a, &b, &c)"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_57a0);
  }
  bVar1 = std::operator==(anon_var_dwarf_5c82,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_5920,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x581);
    poVar2 = LogMessage::stream(&local_5920);
    std::operator<<(poVar2,anon_var_dwarf_5e26);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5920);
  }
  bVar1 = std::operator==(anon_var_dwarf_5cd6,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_80);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_5aa0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x582);
    poVar2 = LogMessage::stream(&local_5aa0);
    std::operator<<(poVar2,anon_var_dwarf_5e32);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5aa0);
  }
  bVar1 = std::operator==(anon_var_dwarf_5be6 + 0xf,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_5c20,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x583);
    poVar2 = LogMessage::stream(&local_5c20);
    std::operator<<(poVar2,anon_var_dwarf_5e3e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5c20);
  }
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(RE2, UnicodeClasses) {
  const string str = "ABCDEFGHI譚永鋒";
  string a, b, c;

  EXPECT_TRUE(RE2::FullMatch("A", "\\p{L}"));
  EXPECT_TRUE(RE2::FullMatch("A", "\\p{Lu}"));
  EXPECT_FALSE(RE2::FullMatch("A", "\\p{Ll}"));
  EXPECT_FALSE(RE2::FullMatch("A", "\\P{L}"));
  EXPECT_FALSE(RE2::FullMatch("A", "\\P{Lu}"));
  EXPECT_TRUE(RE2::FullMatch("A", "\\P{Ll}"));

  EXPECT_TRUE(RE2::FullMatch("譚", "\\p{L}"));
  EXPECT_FALSE(RE2::FullMatch("譚", "\\p{Lu}"));
  EXPECT_FALSE(RE2::FullMatch("譚", "\\p{Ll}"));
  EXPECT_FALSE(RE2::FullMatch("譚", "\\P{L}"));
  EXPECT_TRUE(RE2::FullMatch("譚", "\\P{Lu}"));
  EXPECT_TRUE(RE2::FullMatch("譚", "\\P{Ll}"));

  EXPECT_TRUE(RE2::FullMatch("永", "\\p{L}"));
  EXPECT_FALSE(RE2::FullMatch("永", "\\p{Lu}"));
  EXPECT_FALSE(RE2::FullMatch("永", "\\p{Ll}"));
  EXPECT_FALSE(RE2::FullMatch("永", "\\P{L}"));
  EXPECT_TRUE(RE2::FullMatch("永", "\\P{Lu}"));
  EXPECT_TRUE(RE2::FullMatch("永", "\\P{Ll}"));

  EXPECT_TRUE(RE2::FullMatch("鋒", "\\p{L}"));
  EXPECT_FALSE(RE2::FullMatch("鋒", "\\p{Lu}"));
  EXPECT_FALSE(RE2::FullMatch("鋒", "\\p{Ll}"));
  EXPECT_FALSE(RE2::FullMatch("鋒", "\\P{L}"));
  EXPECT_TRUE(RE2::FullMatch("鋒", "\\P{Lu}"));
  EXPECT_TRUE(RE2::FullMatch("鋒", "\\P{Ll}"));

  EXPECT_TRUE(RE2::PartialMatch(str, "(.).*?(.).*?(.)", &a, &b, &c));
  EXPECT_EQ("A", a);
  EXPECT_EQ("B", b);
  EXPECT_EQ("C", c);

  EXPECT_TRUE(RE2::PartialMatch(str, "(.).*?([\\p{L}]).*?(.)", &a, &b, &c));
  EXPECT_EQ("A", a);
  EXPECT_EQ("B", b);
  EXPECT_EQ("C", c);

  EXPECT_FALSE(RE2::PartialMatch(str, "\\P{L}"));

  EXPECT_TRUE(RE2::PartialMatch(str, "(.).*?([\\p{Lu}]).*?(.)", &a, &b, &c));
  EXPECT_EQ("A", a);
  EXPECT_EQ("B", b);
  EXPECT_EQ("C", c);

  EXPECT_FALSE(RE2::PartialMatch(str, "[^\\p{Lu}\\p{Lo}]"));

  EXPECT_TRUE(RE2::PartialMatch(str, ".*(.).*?([\\p{Lu}\\p{Lo}]).*?(.)", &a, &b, &c));
  EXPECT_EQ("譚", a);
  EXPECT_EQ("永", b);
  EXPECT_EQ("鋒", c);
}